

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O2

bool __thiscall
CStorage::FindFile(CStorage *this,char *pFilename,char *pPath,int Type,char *pBuffer,int BufferSize)

{
  bool bVar1;
  long in_FS_OFFSET;
  CFindCBData local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.m_pWantedSha256 = (SHA256_DIGEST *)0x0;
  local_48.m_WantedCrc = 0;
  local_48.m_WantedSize = 0;
  local_48.m_CheckHashAndSize = false;
  local_48.m_pStorage = this;
  local_48.m_pFilename = pFilename;
  local_48.m_pPath = pPath;
  local_48.m_pBuffer = pBuffer;
  local_48.m_BufferSize = BufferSize;
  bVar1 = FindFileImpl(this,Type,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

virtual bool FindFile(const char *pFilename, const char *pPath, int Type, char *pBuffer, int BufferSize)
	{
		CFindCBData Data;
		Data.m_pStorage = this;
		Data.m_pFilename = pFilename;
		Data.m_pPath = pPath;
		Data.m_pBuffer = pBuffer;
		Data.m_BufferSize = BufferSize;
		Data.m_pWantedSha256 = 0;
		Data.m_WantedCrc = 0;
		Data.m_WantedSize = 0;
		Data.m_CheckHashAndSize = false;
		return FindFileImpl(Type, &Data);
	}